

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fClippingTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::anon_unknown_0::PolyEdgesTestGroup::init
          (PolyEdgesTestGroup *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  float fVar2;
  int extraout_EAX;
  TestNode *pTVar3;
  long lVar4;
  TriangleFillTest *this_00;
  long lVar5;
  char *in_RCX;
  WindowRectangle *in_R8;
  Vector<float,_3> *b;
  int tri;
  uint uVar6;
  Vec3 v2;
  Vec3 vertex0;
  Vec3 vertex1;
  Vec3 v1;
  Vec3 *in_stack_fffffffffffffcd8;
  float local_318;
  float fStack_314;
  float afStack_310 [2];
  Vector<float,_3> local_308;
  Vector<float,_3> local_2f8;
  Vector<float,_4> local_2e8;
  Vector<float,_3> *local_2d8;
  Vector<float,_3> *local_2d0;
  tcu local_2c4 [8];
  float local_2bc;
  TriangleFillTest *local_2b8;
  Vector<float,_3> local_2b0;
  Vector<float,_3> local_2a4;
  long local_298;
  vector<deqp::gles2::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
  *local_290;
  string local_288;
  Vector<float,_3> local_264;
  FillTriangle local_258;
  undefined1 local_1f8 [16];
  undefined1 auStack_1e8 [16];
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  char local_118 [12];
  undefined1 auStack_10c [12];
  undefined1 auStack_100 [16];
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined4 local_b0;
  char local_a8 [12];
  undefined1 auStack_9c [20];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_a8[0] = '\0';
  local_a8[1] = '\0';
  local_a8[2] = -0x80;
  local_a8[3] = '?';
  local_a8[4] = '\0';
  local_a8[5] = '\0';
  local_a8[6] = -0x80;
  local_a8[7] = '?';
  stack0xffffffffffffff60 = 0x3f8000003f800000;
  auStack_9c._4_8_ = 0x3f800000bf800000;
  auStack_9c._12_8_ = 0x3f8000003f800000;
  local_88 = 0xbf8000003f800000;
  uStack_80 = 0x3f8000003f8ccccd;
  local_78 = 0x3f8000003f800000;
  uStack_70 = 0xbf80000000000000;
  local_68 = 0x3f800000;
  uStack_60 = 0x3f80000000000000;
  local_58 = 0x3f80000000000000;
  uStack_50 = 0;
  local_48 = 0x3f80000000000000;
  uStack_40 = 0x3f80000000000000;
  local_38 = 0x3dcccccd;
  local_118[0] = '\0';
  local_118[1] = '\0';
  local_118[2] = -0x80;
  local_118[3] = '?';
  local_118[4] = '\n';
  local_118[5] = -0x29;
  local_118[6] = '#';
  local_118[7] = '<';
  stack0xfffffffffffffef0 = 0;
  auStack_10c._4_8_ = 0x3c23d70a;
  auStack_100._0_8_ = 0x3f7d70a400000000;
  auStack_100._8_8_ = 0x3c23d70a00000000;
  uStack_f0 = 0x3f800000;
  local_e8 = 0x3c23d70a;
  uStack_e0 = 0x3f7d70a400000000;
  local_d8 = 0;
  uStack_d0 = 0x3f8000003f800000;
  local_c8 = 0x3c23d70a3c23d70a;
  uStack_c0 = 0xbc23d70a;
  local_b8 = 0;
  local_b0 = 0x3f7d70a4;
  for (local_318 = 0.0; (int)local_318 < 5; local_318 = (float)((int)local_318 + 1)) {
    pTVar3 = (TestNode *)operator_new(0xa0);
    pCVar1 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,"quad_at_origin_",(allocator<char> *)&local_308);
    de::toString<int>(&local_288,(int *)&local_318);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_258,
                   &local_288);
    in_RCX = local_a8 + (long)(int)local_318 * 0x18;
    in_R8 = (WindowRectangle *)(auStack_9c + (long)(int)local_318 * 0x18);
    local_2e8.m_data[0] = 0.0;
    local_2e8.m_data[1] = 0.0;
    local_2e8.m_data._8_8_ = local_2e8.m_data._8_8_ & 0xffffffff00000000;
    QuadFillTest::QuadFillTest
              ((QuadFillTest *)pTVar3,pCVar1,(char *)local_1f8._0_8_,in_RCX,in_R8,(Vec3 *)&local_2e8
               ,in_stack_fffffffffffffcd8,(Vec3 *)this);
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    std::__cxx11::string::~string((string *)local_1f8);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_258);
  }
  fVar2 = 0.0;
  while (local_2e8.m_data[0] = fVar2, (int)fVar2 < 3) {
    pTVar3 = (TestNode *)operator_new(0xa0);
    pCVar1 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,"quad_near_edge_",(allocator<char> *)&local_318);
    de::toString<int>(&local_288,(int *)&local_2e8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_258,
                   &local_288);
    lVar4 = (long)(int)local_2e8.m_data[0] * 0x24;
    in_RCX = local_118 + lVar4;
    in_R8 = (WindowRectangle *)(auStack_10c + lVar4);
    QuadFillTest::QuadFillTest
              ((QuadFillTest *)pTVar3,pCVar1,(char *)local_1f8._0_8_,in_RCX,in_R8,
               (Vec3 *)(auStack_100 + lVar4),in_stack_fffffffffffffcd8,(Vec3 *)this);
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    std::__cxx11::string::~string((string *)local_1f8);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_258);
    fVar2 = (float)((int)local_2e8.m_data[0] + 1);
  }
  this_00 = (TriangleFillTest *)operator_new(0xa0);
  TriangleFillTest::TriangleFillTest
            (this_00,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"poly_fan",in_RCX,
             in_R8);
  (this_00->super_FillTest).super_RenderTestCase.super_TestCase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__TriangleFillTest_00721240;
  local_288._M_dataplus._M_p = (pointer)0x3f0000003f000000;
  local_288._M_string_length = 0x3f0000003f000000;
  local_2e8.m_data[0] = 0.0;
  local_2e8.m_data[1] = 0.0;
  local_2e8.m_data[2] = 0.5;
  local_2e8.m_data[3] = 0.0;
  local_1f8._0_8_ = (pointer)0x3f8000003f800000;
  local_1f8._8_8_ = 0x3f800000;
  auStack_1e8._0_8_ = 0x3f8000003f800000;
  auStack_1e8._8_8_ = 0x3f800000;
  local_1d8 = 0x3f8000003f800000;
  uStack_1d0 = 0x3f800000bf800000;
  local_1c8 = 0x3f800000;
  uStack_1c0 = 0x3f8000003f800000;
  local_1b8 = 0xbf800000;
  uStack_1b0 = 0xbf8000003f800000;
  local_1a8 = 0x3f800000bf800000;
  uStack_1a0 = 0xbf800000;
  local_198 = 0xbf80000000000000;
  uStack_190 = 0xbf800000bf800000;
  local_188 = 0xbf800000bf800000;
  uStack_180 = 0xbf80000000000000;
  local_178 = 0xbf800000bf800000;
  uStack_170 = 0xbf80000000000000;
  local_168 = 0x3f800000bf800000;
  uStack_160 = 0xbf800000bf800000;
  local_158 = 0xbf80000000000000;
  uStack_150 = 0x3f800000bf800000;
  local_148 = 0xbf80000000000000;
  uStack_140 = 0x3f8000003f800000;
  local_138 = 0x3f800000bf800000;
  uStack_130 = 0;
  local_128 = 0x3f8000003f800000;
  local_290 = &this_00->m_triangles;
  lVar4 = 0;
  local_2b8 = this_00;
  do {
    if (lVar4 == 6) {
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)local_2b8);
      return extraout_EAX;
    }
    lVar5 = lVar4 * 0x24;
    b = (Vector<float,_3> *)(local_1f8 + lVar5);
    local_2d0 = (Vector<float,_3> *)(auStack_1e8 + lVar5 + -4);
    local_2d8 = (Vector<float,_3> *)(auStack_1e8 + lVar5 + 8);
    uVar6 = 0;
    local_298 = lVar4;
    while( true ) {
      if (uVar6 == 0x28) break;
      tcu::Vector<float,_3>::Vector(&local_308);
      tcu::Vector<float,_3>::Vector(&local_2f8);
      if (uVar6 == 0) {
        local_308.m_data[2] = local_2d0->m_data[2];
        local_308.m_data._0_8_ = *(undefined8 *)local_2d0->m_data;
LAB_003bb79e:
        tcu::operator-((tcu *)&local_258,local_2d0,b);
        tcu::operator-((tcu *)&local_318,local_2d8,b);
        tcu::Vector<float,_3>::Vector(&local_264,(float)(int)(uVar6 + 1) / 40.0);
        tcu::mix<float,3>((tcu *)&local_2b0,(Vector<float,_3> *)&local_258,
                          (Vector<float,_3> *)&local_318,&local_264);
        tcu::normalize<float,3>((tcu *)&local_2a4,&local_2b0);
        tcu::operator+(local_2c4,b,&local_2a4);
        local_2f8.m_data[2] = local_2bc;
        local_2f8.m_data._0_8_ = local_2c4;
      }
      else {
        tcu::operator-((tcu *)&local_258,local_2d0,b);
        tcu::operator-((tcu *)&local_318,local_2d8,b);
        tcu::Vector<float,_3>::Vector(&local_264,(float)(int)uVar6 / 40.0);
        tcu::mix<float,3>((tcu *)&local_2b0,(Vector<float,_3> *)&local_258,
                          (Vector<float,_3> *)&local_318,&local_264);
        tcu::normalize<float,3>((tcu *)&local_2a4,&local_2b0);
        tcu::operator+(local_2c4,b,&local_2a4);
        local_308.m_data[2] = local_2bc;
        local_308.m_data._0_8_ = local_2c4;
        if (uVar6 != 0x27) goto LAB_003bb79e;
        local_2f8.m_data[2] = local_2d8->m_data[2];
        local_2f8.m_data._0_8_ = *(undefined8 *)local_2d8->m_data;
      }
      TriangleFillTest::FillTriangle::FillTriangle(&local_258);
      if ((uVar6 & 1) == 0) {
        tcu::operator+((tcu *)&local_318,(Vector<float,_4> *)&local_288,&local_2e8);
        local_258.c0.m_data[1] = fStack_314;
        local_258.c0.m_data[0] = local_318;
        local_258.c0.m_data[2] = afStack_310[0];
        local_258.c0.m_data[3] = afStack_310[1];
        tcu::operator+((tcu *)&local_318,(Vector<float,_4> *)&local_288,&local_2e8);
        local_258.c1.m_data[1] = fStack_314;
        local_258.c1.m_data[0] = local_318;
        local_258.c1.m_data[2] = afStack_310[0];
        local_258.c1.m_data[3] = afStack_310[1];
        tcu::operator+((tcu *)&local_318,(Vector<float,_4> *)&local_288,&local_2e8);
      }
      else {
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_318,(Vector<float,_4> *)&local_288)
        ;
        local_258.c0.m_data[1] = fStack_314;
        local_258.c0.m_data[0] = local_318;
        local_258.c0.m_data[2] = afStack_310[0];
        local_258.c0.m_data[3] = afStack_310[1];
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_318,(Vector<float,_4> *)&local_288)
        ;
        local_258.c1.m_data[1] = fStack_314;
        local_258.c1.m_data[0] = local_318;
        local_258.c1.m_data[2] = afStack_310[0];
        local_258.c1.m_data[3] = afStack_310[1];
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_318,(Vector<float,_4> *)&local_288)
        ;
      }
      local_258.c2.m_data[1] = fStack_314;
      local_258.c2.m_data[0] = local_318;
      local_258.c2.m_data[2] = afStack_310[0];
      local_258.c2.m_data[3] = afStack_310[1];
      local_258.v0.m_data[0] = 0.0;
      local_258.v0.m_data[1] = 0.0;
      local_258.v0.m_data[2] = 0.0;
      local_258.v0.m_data[3] = 1.0;
      local_258.v1.m_data[2] = local_308.m_data[2] * 70000.0;
      local_258.v1.m_data[1] = local_308.m_data[1] * 70000.0;
      local_258.v1.m_data[0] = local_308.m_data[0] * 70000.0;
      local_258.v1.m_data[3] = 1.0;
      local_258.v2.m_data[2] = local_2f8.m_data[2] * 70000.0;
      local_258.v2.m_data[1] = local_2f8.m_data[1] * 70000.0;
      local_258.v2.m_data[0] = local_2f8.m_data[0] * 70000.0;
      local_258.v2.m_data[3] = 1.0;
      std::
      vector<deqp::gles2::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
      ::push_back(local_290,&local_258);
      uVar6 = uVar6 + 1;
    }
    lVar4 = local_298 + 1;
  } while( true );
}

Assistant:

void PolyEdgesTestGroup::init (void)
{
	// Quads via origin
	const struct Quad
	{
		tcu::Vec3 d1; // tangent
		tcu::Vec3 d2; // bi-tangent
	} quads[] =
	{
		{ tcu::Vec3( 1, 1, 1),	tcu::Vec3( 1,   -1, 1) },
		{ tcu::Vec3( 1, 1, 1),	tcu::Vec3(-1, 1.1f, 1) },
		{ tcu::Vec3( 1, 1, 0),	tcu::Vec3(-1,    1, 0) },
		{ tcu::Vec3( 0, 1, 0),	tcu::Vec3( 1,    0, 0) },
		{ tcu::Vec3( 0, 1, 0),	tcu::Vec3( 1, 0.1f, 0) },
	};

	// Quad near edge
	const struct EdgeQuad
	{
		tcu::Vec3 d1;		// tangent
		tcu::Vec3 d2;		// bi-tangent
		tcu::Vec3 center;	// center
	} edgeQuads[] =
	{
		{ tcu::Vec3( 1,     0.01f, 0    ),	tcu::Vec3( 0,      0.01f,  0),  tcu::Vec3( 0,     0.99f, 0    ) }, // edge near x-plane
		{ tcu::Vec3( 0.01f, 1,     0    ),	tcu::Vec3( 0.01f,  0,      0),  tcu::Vec3( 0.99f, 0,     0    ) }, // edge near y-plane
		{ tcu::Vec3( 1,     1,     0.01f),	tcu::Vec3( 0.01f,  -0.01f, 0),  tcu::Vec3( 0,     0,     0.99f) }, // edge near z-plane
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(quads); ++ndx)
		addChild(new QuadFillTest(m_context, (std::string("quad_at_origin_") + de::toString(ndx)).c_str(), "polygon edge clipping", VIEWPORT_CENTER, quads[ndx].d1, quads[ndx].d2));
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(edgeQuads); ++ndx)
		addChild(new QuadFillTest(m_context, (std::string("quad_near_edge_") + de::toString(ndx)).c_str(), "polygon edge clipping", VIEWPORT_CENTER, edgeQuads[ndx].d1, edgeQuads[ndx].d2, edgeQuads[ndx].center));

	// Polyfan
	addChild(new TriangleFanFillTest(m_context, "poly_fan", "polygon edge clipping", VIEWPORT_CENTER));
}